

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int archive_read_format_rar_read_header(archive_read *a,archive_entry *entry)

{
  char head_type;
  ushort uVar1;
  uint *puVar2;
  long lVar3;
  short sVar4;
  uint uVar5;
  int *piVar6;
  void *pvVar7;
  undefined8 uVar8;
  short *psVar9;
  char *pcVar10;
  int iVar11;
  long request;
  long request_00;
  ulong uVar12;
  ssize_t *unaff_R12;
  long lVar13;
  ulong min;
  bool bVar14;
  long local_38;
  
  (a->archive).archive_format = 0xd0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "RAR";
  }
  puVar2 = (uint *)a->format->data;
  if (puVar2[0x13d4] == 0xffffffff) {
    puVar2[0x13d4] = 0;
  }
  piVar6 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0);
  if (piVar6 == (int *)0x0) {
    uVar5 = 1;
  }
  else {
    if ((puVar2[0x3e] == 0) &&
       ((((char)*piVar6 == 'M' && (*(char *)((long)piVar6 + 1) == 'Z')) || (*piVar6 == 0x464c457f)))
       ) {
      lVar13 = 0;
      unaff_R12 = &local_38;
      uVar12 = 0x1000;
      do {
        while( true ) {
          if (0x20000 < uVar12 + lVar13) goto LAB_0012d0c4;
          pvVar7 = __archive_read_ahead(a,uVar12,unaff_R12);
          if (pvVar7 == (void *)0x0) break;
          if (local_38 < 0x40) goto LAB_0012d0c4;
          request = 0;
          do {
            if (*(int *)((long)pvVar7 + request + 3) == 0x71a21 &&
                *(int *)((long)pvVar7 + request) == 0x21726152) {
              __archive_read_consume(a,request);
              bVar14 = false;
              iVar11 = 0;
              goto LAB_0012d0e1;
            }
            request_00 = request + 0x10;
            lVar3 = request + 0x17;
            request = request_00;
          } while ((ulong)((long)pvVar7 + lVar3) < (ulong)(local_38 + (long)pvVar7));
          __archive_read_consume(a,request_00);
          lVar13 = lVar13 + request_00;
        }
        bVar14 = 0x7f < uVar12;
        uVar12 = uVar12 >> 1;
      } while (bVar14);
LAB_0012d0c4:
      archive_set_error(&a->archive,0x54,"Couldn\'t find out RAR header");
      iVar11 = -0x1e;
      bVar14 = true;
LAB_0012d0e1:
      if (bVar14) {
        return iVar11;
      }
    }
    puVar2[0x3e] = 1;
    do {
      bVar14 = false;
      piVar6 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0);
      uVar5 = 0xffffffe2;
      if (piVar6 == (int *)0x0) goto LAB_0012d3c4;
      head_type = *(char *)((long)piVar6 + 2);
      switch(head_type) {
      case 'r':
        if (*(int *)((long)piVar6 + 3) == 0x71a21 && *piVar6 == 0x21726152) {
          uVar12 = 7;
LAB_0012d3b3:
          __archive_read_consume(a,uVar12);
LAB_0012d3be:
          bVar14 = true;
          uVar5 = (uint)unaff_R12;
          goto LAB_0012d3c4;
        }
        pcVar10 = "Invalid marker header";
        goto LAB_0012d2ff;
      case 's':
        *puVar2 = (uint)*(ushort *)((long)piVar6 + 3);
        uVar1 = *(ushort *)((long)piVar6 + 5);
        uVar12 = (ulong)uVar1;
        if (uVar1 < 0xd) {
LAB_0012d2d6:
          pcVar10 = "Invalid header size";
LAB_0012d155:
          archive_set_error(&a->archive,0x54,pcVar10);
        }
        else {
          psVar9 = (short *)__archive_read_ahead(a,uVar12,(ssize_t *)0x0);
          if (psVar9 != (short *)0x0) {
            *(undefined2 *)(puVar2 + 4) = *(undefined2 *)((long)psVar9 + 7);
            *(undefined4 *)((long)puVar2 + 0x12) = *(undefined4 *)((long)psVar9 + 9);
            if ((*puVar2 >> 9 & 1) != 0) {
              if (uVar1 == 0xd) goto LAB_0012d2d6;
              *(undefined1 *)((long)puVar2 + 0x16) = *(undefined1 *)((long)psVar9 + 0xd);
            }
            if ((char)*puVar2 < '\0') {
              archive_entry_set_is_metadata_encrypted(entry,'\x01');
              archive_entry_set_is_data_encrypted(entry,'\x01');
              puVar2[0x13d4] = 1;
              pcVar10 = "RAR encryption support unavailable.";
            }
            else {
              sVar4 = crc32(0,psVar9 + 1,uVar1 - 2);
              if (*psVar9 == sVar4) goto LAB_0012d3b3;
              pcVar10 = "Header CRC error";
            }
            goto LAB_0012d155;
          }
        }
LAB_0012d15c:
        bVar14 = false;
        uVar5 = 0xffffffe2;
        goto LAB_0012d3c4;
      case 't':
        uVar5 = read_header(a,entry,head_type);
        break;
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case '{':
        uVar1 = *(ushort *)((long)piVar6 + 5);
        uVar12 = (ulong)uVar1;
        if (uVar1 < 7) {
LAB_0012d143:
          pcVar10 = "Invalid header size too small";
          goto LAB_0012d155;
        }
        if ((char)piVar6[1] < '\0') {
          if (uVar1 < 0xb) goto LAB_0012d143;
          piVar6 = (int *)__archive_read_ahead(a,uVar12,(ssize_t *)0x0);
          if (piVar6 == (int *)0x0) goto LAB_0012d15c;
          uVar12 = uVar12 + *(uint *)((long)piVar6 + 7);
        }
        iVar11 = *piVar6;
        __archive_read_consume(a,2);
        uVar8 = 0;
        for (uVar12 = uVar12 - 2; uVar12 != 0; uVar12 = uVar12 - min) {
          min = 0x8000;
          if (uVar12 < 0x8000) {
            min = uVar12;
          }
          pvVar7 = __archive_read_ahead(a,min,(ssize_t *)0x0);
          if (pvVar7 == (void *)0x0) {
            archive_set_error(&a->archive,0x54,"Bad RAR file");
            bVar14 = false;
            uVar5 = 0xffffffe2;
            goto LAB_0012d3c4;
          }
          uVar8 = crc32(uVar8,pvVar7,min & 0xffffffff);
          __archive_read_consume(a,min);
        }
        if ((short)iVar11 != (short)uVar8) {
          archive_set_error(&a->archive,0x54,"Header CRC error");
          goto LAB_0012d15c;
        }
        if (head_type != '{') goto LAB_0012d3be;
        uVar5 = 1;
        break;
      case 'z':
        uVar5 = read_header(a,entry,head_type);
        if (-0x15 < (int)uVar5) goto LAB_0012d3be;
        break;
      default:
        pcVar10 = "Bad RAR file";
LAB_0012d2ff:
        bVar14 = false;
        archive_set_error(&a->archive,0x54,pcVar10);
        goto LAB_0012d3c4;
      }
      bVar14 = false;
LAB_0012d3c4:
      unaff_R12 = (ssize_t *)(ulong)uVar5;
    } while (bVar14);
  }
  return uVar5;
}

Assistant:

static int
archive_read_format_rar_read_header(struct archive_read *a,
                                    struct archive_entry *entry)
{
  const void *h;
  const char *p;
  struct rar *rar;
  size_t skip;
  char head_type;
  int ret;
  unsigned flags;
  unsigned long crc32_expected;

  a->archive.archive_format = ARCHIVE_FORMAT_RAR;
  if (a->archive.archive_format_name == NULL)
    a->archive.archive_format_name = "RAR";

  rar = (struct rar *)(a->format->data);

  /*
   * It should be sufficient to call archive_read_next_header() for
   * a reader to determine if an entry is encrypted or not. If the
   * encryption of an entry is only detectable when calling
   * archive_read_data(), so be it. We'll do the same check there
   * as well.
   */
  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  /* RAR files can be generated without EOF headers, so return ARCHIVE_EOF if
  * this fails.
  */
  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_EOF);

  p = h;
  if (rar->found_first_header == 0 &&
     ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0)) {
    /* This is an executable ? Must be self-extracting... */
    ret = skip_sfx(a);
    if (ret < ARCHIVE_WARN)
      return (ret);
  }
  rar->found_first_header = 1;

  while (1)
  {
    unsigned long crc32_val;

    if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
      return (ARCHIVE_FATAL);
    p = h;

    head_type = p[2];
    switch(head_type)
    {
    case MARK_HEAD:
      if (memcmp(p, RAR_SIGNATURE, 7) != 0) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid marker header");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, 7);
      break;

    case MAIN_HEAD:
      rar->main_flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size");
        return (ARCHIVE_FATAL);
      }
      if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
        return (ARCHIVE_FATAL);
      p = h;
      memcpy(rar->reserved1, p + 7, sizeof(rar->reserved1));
      memcpy(rar->reserved2, p + 7 + sizeof(rar->reserved1),
             sizeof(rar->reserved2));
      if (rar->main_flags & MHD_ENCRYPTVER) {
        if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)+1) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size");
          return (ARCHIVE_FATAL);
        }
        rar->encryptver = *(p + 7 + sizeof(rar->reserved1) +
                            sizeof(rar->reserved2));
      }

      /* Main header is password encrypted, so we cannot read any
         file names or any other info about files from the header. */
      if (rar->main_flags & MHD_PASSWORD)
      {
        archive_entry_set_is_metadata_encrypted(entry, 1);
        archive_entry_set_is_data_encrypted(entry, 1);
        rar->has_encrypted_entries = 1;
         archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "RAR encryption support unavailable.");
        return (ARCHIVE_FATAL);
      }

      crc32_val = crc32(0, (const unsigned char *)p + 2, (unsigned)skip - 2);
      if ((crc32_val & 0xffff) != archive_le16dec(p)) {
#ifndef DONT_FAIL_ON_CRC_ERROR
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Header CRC error");
        return (ARCHIVE_FATAL);
#endif
      }
      __archive_read_consume(a, skip);
      break;

    case FILE_HEAD:
      return read_header(a, entry, head_type);

    case COMM_HEAD:
    case AV_HEAD:
    case SUB_HEAD:
    case PROTECT_HEAD:
    case SIGN_HEAD:
    case ENDARC_HEAD:
      flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size too small");
        return (ARCHIVE_FATAL);
      }
      if (flags & HD_ADD_SIZE_PRESENT)
      {
        if (skip < 7 + 4) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size too small");
          return (ARCHIVE_FATAL);
        }
        if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
          return (ARCHIVE_FATAL);
        p = h;
        skip += archive_le32dec(p + 7);
      }

      /* Skip over the 2-byte CRC at the beginning of the header. */
      crc32_expected = archive_le16dec(p);
      __archive_read_consume(a, 2);
      skip -= 2;

      /* Skim the entire header and compute the CRC. */
      crc32_val = 0;
      while (skip > 0) {
	      size_t to_read = skip;
	      if (to_read > 32 * 1024)
		      to_read = 32 * 1024;
	      if ((h = __archive_read_ahead(a, to_read, NULL)) == NULL) {
		      archive_set_error(&a->archive,  ARCHIVE_ERRNO_FILE_FORMAT,
			  "Bad RAR file");
		      return (ARCHIVE_FATAL);
	      }
	      p = h;
	      crc32_val = crc32(crc32_val, (const unsigned char *)p, (unsigned int)to_read);
	      __archive_read_consume(a, to_read);
	      skip -= to_read;
      }
      if ((crc32_val & 0xffff) != crc32_expected) {
#ifndef DONT_FAIL_ON_CRC_ERROR
	      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		  "Header CRC error");
	      return (ARCHIVE_FATAL);
#endif
      }
      if (head_type == ENDARC_HEAD)
	      return (ARCHIVE_EOF);
      break;

    case NEWSUB_HEAD:
      if ((ret = read_header(a, entry, head_type)) < ARCHIVE_WARN)
        return ret;
      break;

    default:
      archive_set_error(&a->archive,  ARCHIVE_ERRNO_FILE_FORMAT,
                        "Bad RAR file");
      return (ARCHIVE_FATAL);
    }
  }
}